

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMockerBase<int_(int,_int,_int)>::PerformDefaultAction
          (FunctionMockerBase<int_(int,_int,_int)> *this,ArgumentTuple *args,
          string *call_description)

{
  bool bVar1;
  Action<int_(int,_int,_int)> *this_00;
  runtime_error *this_01;
  undefined1 local_50 [8];
  string message;
  OnCallSpec<int_(int,_int,_int)> *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMockerBase<int_(int,_int,_int)> *this_local;
  
  message.field_2._8_8_ = FindOnCallSpec(this,args);
  if ((OnCallSpec<int_(int,_int,_int)> *)message.field_2._8_8_ ==
      (OnCallSpec<int_(int,_int,_int)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<int>::Exists();
    if (!bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)local_50);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = DefaultValue<int>::Get();
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    this_00 = OnCallSpec<int_(int,_int,_int)>::GetAction
                        ((OnCallSpec<int_(int,_int,_int)> *)message.field_2._8_8_);
    this_local._4_4_ = Action<int_(int,_int,_int)>::Perform(this_00,args);
  }
  return this_local._4_4_;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }